

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc64ad.c
# Opt level: O0

int_t mc64wd_(int_t *n,int_t *ne,int_t *ip,int_t *irn,double *a,int *iperm,int_t *num,int_t *jperm,
             int_t *out,int_t *pr,int_t *q,int_t *l,double *u,double *d__)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  double rinf;
  int_t local_d0;
  int_t jdum;
  int_t qlen;
  int_t jord;
  double dnew;
  double dmin__;
  int_t local_b0;
  int_t low;
  int_t jsp;
  int_t isp;
  double csp;
  int_t kk2;
  int_t kk1;
  double dq0;
  double dStack_88;
  int_t up;
  double vj;
  int local_78;
  int_t kk;
  int_t jj;
  int_t ii;
  double di;
  int_t q0;
  int_t k2;
  int_t k1;
  int_t k0;
  int_t i0;
  int_t k;
  int_t j;
  int_t i__;
  int_t c__2;
  int_t i__3;
  int_t i__2;
  int_t i__1;
  int *iperm_local;
  double *a_local;
  int_t *irn_local;
  int_t *ip_local;
  int_t *ne_local;
  int_t *n_local;
  
  j = 2;
  _i__2 = iperm + -1;
  irn_local = ip + -1;
  iperm_local = (int *)(a + -1);
  a_local = (double *)(irn + -1);
  ip_local = ne;
  ne_local = n;
  dVar5 = dmach("Overflow");
  *num = 0;
  iVar1 = *ne_local;
  for (k0 = 1; k0 <= iVar1; k0 = k0 + 1) {
    u[(long)k0 + -1] = dVar5;
    d__[(long)k0 + -1] = 0.0;
    _i__2[k0] = 0;
    jperm[(long)k0 + -1] = 0;
    pr[(long)k0 + -1] = irn_local[k0];
    l[(long)k0 + -1] = 0;
  }
  iVar1 = *ne_local;
  for (i0 = 1; i0 <= iVar1; i0 = i0 + 1) {
    iVar2 = irn_local[i0 + 1];
    for (k0 = irn_local[i0]; k0 <= iVar2 + -1; k0 = k0 + 1) {
      iVar3 = *(int *)((long)a_local + (long)k0 * 4);
      if (*(double *)(iperm_local + (long)k0 * 2) < u[(long)iVar3 + -1] ||
          *(double *)(iperm_local + (long)k0 * 2) == u[(long)iVar3 + -1]) {
        u[(long)iVar3 + -1] = *(double *)(iperm_local + (long)k0 * 2);
        _i__2[iVar3] = i0;
        l[(long)iVar3 + -1] = k0;
      }
    }
  }
  iVar1 = *ne_local;
  for (k = 1; k <= iVar1; k = k + 1) {
    iVar2 = _i__2[k];
    if ((iVar2 != 0) && (_i__2[k] = 0, jperm[(long)iVar2 + -1] == 0)) {
      *num = *num + 1;
      _i__2[k] = iVar2;
      jperm[(long)iVar2 + -1] = l[(long)k + -1];
    }
  }
  if (*num != *ne_local) {
    iVar1 = *ne_local;
    for (i0 = 1; i0 <= iVar1; i0 = i0 + 1) {
      if (jperm[(long)i0 + -1] == 0) {
        q0 = irn_local[i0];
        di._4_4_ = irn_local[i0 + 1] + -1;
        dVar4 = dVar5;
        k0 = q0;
        if (q0 <= di._4_4_) {
          for (; dStack_88 = dVar4, k0 <= di._4_4_; k0 = k0 + 1) {
            iVar2 = *(int *)((long)a_local + (long)k0 * 4);
            _jj = *(double *)(iperm_local + (long)k0 * 2) - u[(long)iVar2 + -1];
            if (_jj <= dStack_88) {
              if (dStack_88 <= _jj) {
                if (((_jj != dVar5) || (NAN(_jj) || NAN(dVar5))) &&
                   ((_i__2[iVar2] != 0 || (_i__2[k1] == 0)))) goto LAB_0011d763;
              }
              k2 = k0;
              dStack_88 = _jj;
              k1 = iVar2;
            }
LAB_0011d763:
            dVar4 = dStack_88;
          }
          d__[(long)i0 + -1] = dStack_88;
          k0 = k2;
          k = k1;
          if (_i__2[k1] == 0) {
LAB_0011d904:
            *num = *num + 1;
            jperm[(long)i0 + -1] = k0;
            _i__2[k] = i0;
            pr[(long)i0 + -1] = k0 + 1;
          }
          else {
            for (; k0 <= di._4_4_; k0 = k0 + 1) {
              k = *(int *)((long)a_local + (long)k0 * 4);
              if (*(double *)(iperm_local + (long)k0 * 2) - u[(long)k + -1] <= dStack_88) {
                local_78 = _i__2[k];
                csp._4_4_ = pr[(long)local_78 + -1];
                csp._0_4_ = irn_local[local_78 + 1] + -1;
                vj._4_4_ = csp._4_4_;
                if (csp._4_4_ <= csp._0_4_) {
                  for (; i__ = csp._0_4_, vj._4_4_ <= csp._0_4_; vj._4_4_ = vj._4_4_ + 1) {
                    kk = *(int *)((long)a_local + (long)vj._4_4_ * 4);
                    if ((_i__2[kk] < 1) &&
                       (*(double *)(iperm_local + (long)vj._4_4_ * 2) - u[(long)kk + -1] <=
                        d__[(long)local_78 + -1])) {
                      jperm[(long)local_78 + -1] = vj._4_4_;
                      _i__2[kk] = local_78;
                      pr[(long)local_78 + -1] = vj._4_4_ + 1;
                      goto LAB_0011d904;
                    }
                  }
                  pr[(long)local_78 + -1] = irn_local[local_78 + 1];
                }
              }
            }
          }
        }
      }
    }
    if (*num != *ne_local) {
      iVar1 = *ne_local;
      for (k = 1; k <= iVar1; k = k + 1) {
        d__[(long)k + -1] = dVar5;
        l[(long)k + -1] = 0;
      }
      i__3 = *ne_local;
      for (jdum = 1; jdum <= i__3; jdum = jdum + 1) {
        if (jperm[(long)jdum + -1] == 0) {
          local_d0 = 0;
          dmin__._4_4_ = *ne_local + 1;
          dq0._4_4_ = *ne_local + 1;
          i0 = jdum;
          pr[(long)jdum + -1] = -1;
          iVar1 = irn_local[jdum + 1];
          dnew = dVar5;
          _jsp = dVar5;
          for (k0 = irn_local[jdum]; c__2 = local_d0, k0 <= iVar1 + -1; k0 = k0 + 1) {
            iVar2 = *(int *)((long)a_local + (long)k0 * 4);
            _qlen = *(double *)(iperm_local + (long)k0 * 2) - u[(long)iVar2 + -1];
            if (_qlen < _jsp) {
              if (_i__2[iVar2] == 0) {
                low = k0;
                local_b0 = jdum;
                _jsp = _qlen;
              }
              else {
                if (_qlen < dnew) {
                  dnew = _qlen;
                }
                d__[(long)iVar2 + -1] = _qlen;
                local_d0 = local_d0 + 1;
                q[(long)local_d0 + -1] = k0;
              }
            }
          }
          di._0_4_ = local_d0;
          local_d0 = 0;
          for (vj._4_4_ = 1; vj._4_4_ <= c__2; vj._4_4_ = vj._4_4_ + 1) {
            k0 = q[(long)vj._4_4_ + -1];
            k = *(int *)((long)a_local + (long)k0 * 4);
            if (d__[(long)k + -1] < _jsp) {
              if (dnew < d__[(long)k + -1]) {
                local_d0 = local_d0 + 1;
                l[(long)k + -1] = local_d0;
                mc64dd_(&k,ne_local,q,d__,l,&j);
              }
              else {
                dmin__._4_4_ = dmin__._4_4_ + -1;
                q[(long)dmin__._4_4_ + -1] = k;
                l[(long)k + -1] = dmin__._4_4_;
              }
              local_78 = _i__2[k];
              out[(long)local_78 + -1] = k0;
              pr[(long)local_78 + -1] = i0;
            }
            else {
              d__[(long)k + -1] = dVar5;
            }
          }
          c__2 = *num;
          for (rinf._4_4_ = 1; rinf._4_4_ <= c__2; rinf._4_4_ = rinf._4_4_ + 1) {
            if (dmin__._4_4_ == dq0._4_4_) {
              if ((local_d0 == 0) || (k = *q, _jsp <= d__[(long)k + -1])) break;
              dnew = d__[(long)k + -1];
              do {
                mc64ed_(&local_d0,ne_local,q,d__,l,&j);
                dmin__._4_4_ = dmin__._4_4_ + -1;
                q[(long)dmin__._4_4_ + -1] = k;
                l[(long)k + -1] = dmin__._4_4_;
                if (local_d0 == 0) break;
                k = *q;
              } while (d__[(long)k + -1] <= dnew);
            }
            di._0_4_ = q[(long)(dq0._4_4_ + -1) + -1];
            _kk2 = d__[(long)di._0_4_ + -1];
            if (_jsp <= _kk2) break;
            dq0._4_4_ = dq0._4_4_ + -1;
            i0 = _i__2[di._0_4_];
            dStack_88 = (_kk2 - *(double *)(iperm_local + (long)jperm[(long)i0 + -1] * 2)) +
                        u[(long)di._0_4_ + -1];
            i__ = irn_local[i0 + 1] + -1;
            for (k0 = irn_local[i0]; k0 <= i__; k0 = k0 + 1) {
              k = *(int *)((long)a_local + (long)k0 * 4);
              if ((l[(long)k + -1] < dq0._4_4_) &&
                 (_qlen = (dStack_88 + *(double *)(iperm_local + (long)k0 * 2)) - u[(long)k + -1],
                 _qlen < _jsp)) {
                if (_i__2[k] == 0) {
                  low = k0;
                  local_b0 = i0;
                  _jsp = _qlen;
                }
                else {
                  _jj = d__[(long)k + -1];
                  if ((_qlen < _jj) && (l[(long)k + -1] < dmin__._4_4_)) {
                    d__[(long)k + -1] = _qlen;
                    if (dnew < _qlen) {
                      if (l[(long)k + -1] == 0) {
                        local_d0 = local_d0 + 1;
                        l[(long)k + -1] = local_d0;
                      }
                      mc64dd_(&k,ne_local,q,d__,l,&j);
                    }
                    else {
                      if (l[(long)k + -1] != 0) {
                        mc64fd_(l + (long)k + -1,&local_d0,ne_local,q,d__,l,&j);
                      }
                      dmin__._4_4_ = dmin__._4_4_ + -1;
                      q[(long)dmin__._4_4_ + -1] = k;
                      l[(long)k + -1] = dmin__._4_4_;
                    }
                    local_78 = _i__2[k];
                    out[(long)local_78 + -1] = k0;
                    pr[(long)local_78 + -1] = i0;
                  }
                }
              }
            }
          }
          if ((_jsp != dVar5) || (NAN(_jsp) || NAN(dVar5))) {
            *num = *num + 1;
            _i__2[*(int *)((long)a_local + (long)low * 4)] = local_b0;
            jperm[(long)local_b0 + -1] = low;
            i0 = local_b0;
            iVar1 = *num;
            rinf._4_4_ = 1;
            while ((rinf._4_4_ <= iVar1 && (local_78 = pr[(long)i0 + -1], local_78 != -1))) {
              iVar2 = out[(long)i0 + -1];
              _i__2[*(int *)((long)a_local + (long)iVar2 * 4)] = local_78;
              jperm[(long)local_78 + -1] = iVar2;
              rinf._4_4_ = rinf._4_4_ + 1;
              i0 = local_78;
            }
            iVar1 = *ne_local;
            for (vj._4_4_ = dq0._4_4_; vj._4_4_ <= iVar1; vj._4_4_ = vj._4_4_ + 1) {
              iVar2 = q[(long)vj._4_4_ + -1];
              u[(long)iVar2 + -1] = (u[(long)iVar2 + -1] + d__[(long)iVar2 + -1]) - _jsp;
            }
          }
          iVar1 = *ne_local;
          for (vj._4_4_ = dmin__._4_4_; vj._4_4_ <= iVar1; vj._4_4_ = vj._4_4_ + 1) {
            iVar2 = q[(long)vj._4_4_ + -1];
            d__[(long)iVar2 + -1] = dVar5;
            l[(long)iVar2 + -1] = 0;
          }
          for (vj._4_4_ = 1; vj._4_4_ <= local_d0; vj._4_4_ = vj._4_4_ + 1) {
            iVar1 = q[(long)vj._4_4_ + -1];
            d__[(long)iVar1 + -1] = dVar5;
            l[(long)iVar1 + -1] = 0;
          }
        }
      }
    }
  }
  iVar1 = *ne_local;
  for (i0 = 1; i0 <= iVar1; i0 = i0 + 1) {
    iVar2 = jperm[(long)i0 + -1];
    if (iVar2 == 0) {
      d__[(long)i0 + -1] = 0.0;
    }
    else {
      d__[(long)i0 + -1] =
           *(double *)(iperm_local + (long)iVar2 * 2) -
           u[(long)*(int *)((long)a_local + (long)iVar2 * 4) + -1];
    }
    if (_i__2[i0] == 0) {
      u[(long)i0 + -1] = 0.0;
    }
  }
  if (*num != *ne_local) {
    iVar1 = *ne_local;
    for (i0 = 1; i0 <= iVar1; i0 = i0 + 1) {
      jperm[(long)i0 + -1] = 0;
    }
    k0 = 0;
    iVar1 = *ne_local;
    for (k = 1; k <= iVar1; k = k + 1) {
      if (_i__2[k] == 0) {
        k0 = k0 + 1;
        out[(long)k0 + -1] = k;
      }
      else {
        jperm[(long)_i__2[k] + -1] = k;
      }
    }
    k0 = 0;
    iVar1 = *ne_local;
    for (i0 = 1; i0 <= iVar1; i0 = i0 + 1) {
      if (jperm[(long)i0 + -1] == 0) {
        k0 = k0 + 1;
        _i__2[out[(long)k0 + -1]] = i0;
      }
    }
  }
  return 0;
}

Assistant:

int_t mc64wd_(int_t *n, int_t *ne, int_t *ip, int_t *
	irn, double *a, int *iperm, int_t *num, int_t *jperm, 
	int_t *out, int_t *pr, int_t *q, int_t *l, double *u, 
	double *d__)
{
    /* System generated locals */
    int_t i__1, i__2, i__3, c__2 = 2;

    /* Local variables */
    int_t i__, j, k, i0, k0, k1, k2, q0;
    double di;
    int_t ii, jj, kk;
    double vj;
    int_t up;
    double dq0;
    int_t kk1, kk2;
    double csp;
    int_t isp, jsp, low;
    double dmin__, dnew;
    int_t jord, qlen, jdum;
    double rinf;
    extern /* Subroutine */ int_t
	mc64dd_(int_t *, int_t *, int_t *, double *, int_t *, int_t *),
	mc64ed_(int_t *, int_t *, int_t *, double *, int_t *, int_t *),
	mc64fd_(int_t *, int_t *, int_t *, int_t *, double *, int_t *, int_t *);


/* *** Copyright (c) 1999  Council for the Central Laboratory of the */
/*     Research Councils                                             *** */
/* *** Although every effort has been made to ensure robustness and  *** */
/* *** reliability of the subroutines in this MC64 suite, we         *** */
/* *** disclaim any liability arising through the use or misuse of   *** */
/* *** any of the subroutines.                                       *** */
/* *** Any problems?   Contact ... */
/*     Iain Duff (I.Duff@rl.ac.uk) or Jacko Koster (jak@ii.uib.no)   *** */

/* N, NE, IP, IRN are described in MC64A/AD. */
/* A is a REAL (DOUBLE PRECISION in the D-version) array of length NE. */
/*   A(K), K=1..NE, must be set to the value of the entry that */
/*   corresponds to IRN(K). It is not altered. */
/*   All values A(K) must be non-negative. */
/* IPERM is an INT_T array of length N. On exit, it contains the */
/*   weighted matching: IPERM(I) = 0 or row I is matched to column */
/*   IPERM(I). */
/* NUM is an INT_T variable. On exit, it contains the cardinality of */
/*   the matching stored in IPERM. */
/* IW is an INT_T work array of length 5N. */
/* DW is a REAL (DOUBLE PRECISION in the D-version) array of length 2N. */
/*   On exit, U = D(1:N) contains the dual row variable and */
/*   V = D(N+1:2N) contains the dual column variable. If the matrix */
/*   is structurally nonsingular (NUM = N), the following holds: */
/*      U(I)+V(J) <= A(I,J)  if IPERM(I) |= J */
/*      U(I)+V(J)  = A(I,J)  if IPERM(I)  = J */
/*      U(I) = 0  if IPERM(I) = 0 */
/*      V(J) = 0  if there is no I for which IPERM(I) = J */
/* Local variables */
/* Local parameters */
/* External subroutines and/or functions */
/*      EXTERNAL FD05AD,MC64DD,MC64ED,MC64FD */
/*      DOUBLE PRECISION FD05AD */
/* Set RINF to largest positive real number */
/* XSL      RINF = FD05AD(5) */
    /* Parameter adjustments */
    --d__;
    --u;
    --l;
    --q;
    --pr;
    --out;
    --jperm;
    --iperm;
    --ip;
    --a;
    --irn;

    /* Function Body */
    rinf = dmach("Overflow");
/* Initialization */
    *num = 0;
    i__1 = *n;
    for (k = 1; k <= i__1; ++k) {
	u[k] = rinf;
	d__[k] = 0.;
	iperm[k] = 0;
	jperm[k] = 0;
	pr[k] = ip[k];
	l[k] = 0;
/* L10: */
    }
/* Initialize U(I) */
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	i__2 = ip[j + 1] - 1;
	for (k = ip[j]; k <= i__2; ++k) {
	    i__ = irn[k];
	    if (a[k] > u[i__]) {
		goto L20;
	    }
	    u[i__] = a[k];
	    iperm[i__] = j;
	    l[i__] = k;
L20:
	    ;
	}
/* L30: */
    }
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
	j = iperm[i__];
	if (j == 0) {
	    goto L40;
	}
/* Row I is not empty */
	iperm[i__] = 0;
	if (jperm[j] != 0) {
	    goto L40;
	}
/* Assignment of column J to row I */
	++(*num);
	iperm[i__] = j;
	jperm[j] = l[i__];
L40:
	;
    }
    if (*num == *n) {
	goto L1000;
    }
/* Scan unassigned columns; improve assignment */
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/* JPERM(J) ne 0 iff column J is already assigned */
	if (jperm[j] != 0) {
	    goto L95;
	}
	k1 = ip[j];
	k2 = ip[j + 1] - 1;
/* Continue only if column J is not empty */
	if (k1 > k2) {
	    goto L95;
	}
	vj = rinf;
	i__2 = k2;
	for (k = k1; k <= i__2; ++k) {
	    i__ = irn[k];
	    di = a[k] - u[i__];
	    if (di > vj) {
		goto L50;
	    }
	    if (di < vj || di == rinf) {
		goto L55;
	    }
	    if (iperm[i__] != 0 || iperm[i0] == 0) {
		goto L50;
	    }
L55:
	    vj = di;
	    i0 = i__;
	    k0 = k;
L50:
	    ;
	}
	d__[j] = vj;
	k = k0;
	i__ = i0;
	if (iperm[i__] == 0) {
	    goto L90;
	}
	i__2 = k2;
	for (k = k0; k <= i__2; ++k) {
	    i__ = irn[k];
	    if (a[k] - u[i__] > vj) {
		goto L60;
	    }
	    jj = iperm[i__];
/* Scan remaining part of assigned column JJ */
	    kk1 = pr[jj];
	    kk2 = ip[jj + 1] - 1;
	    if (kk1 > kk2) {
		goto L60;
	    }
	    i__3 = kk2;
	    for (kk = kk1; kk <= i__3; ++kk) {
		ii = irn[kk];
		if (iperm[ii] > 0) {
		    goto L70;
		}
		if (a[kk] - u[ii] <= d__[jj]) {
		    goto L80;
		}
L70:
		;
	    }
	    pr[jj] = kk2 + 1;
L60:
	    ;
	}
	goto L95;
L80:
	jperm[jj] = kk;
	iperm[ii] = jj;
	pr[jj] = kk + 1;
L90:
	++(*num);
	jperm[j] = k;
	iperm[i__] = j;
	pr[j] = k + 1;
L95:
	;
    }
    if (*num == *n) {
	goto L1000;
    }
/* Prepare for main loop */
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
	d__[i__] = rinf;
	l[i__] = 0;
/* L99: */
    }
/* Main loop ... each pass round this loop is similar to Dijkstra's */
/* algorithm for solving the single source shortest path problem */
    i__1 = *n;
    for (jord = 1; jord <= i__1; ++jord) {
	if (jperm[jord] != 0) {
	    goto L100;
	}
/* JORD is next unmatched column */
/* DMIN is the length of shortest path in the tree */
	dmin__ = rinf;
	qlen = 0;
	low = *n + 1;
	up = *n + 1;
/* CSP is the cost of the shortest augmenting path to unassigned row */
/* IRN(ISP). The corresponding column index is JSP. */
	csp = rinf;
/* Build shortest path tree starting from unassigned column (root) JORD */
	j = jord;
	pr[j] = -1;
/* Scan column J */
	i__2 = ip[j + 1] - 1;
	for (k = ip[j]; k <= i__2; ++k) {
	    i__ = irn[k];
	    dnew = a[k] - u[i__];
	    if (dnew >= csp) {
		goto L115;
	    }
	    if (iperm[i__] == 0) {
		csp = dnew;
		isp = k;
		jsp = j;
	    } else {
		if (dnew < dmin__) {
		    dmin__ = dnew;
		}
		d__[i__] = dnew;
		++qlen;
		q[qlen] = k;
	    }
L115:
	    ;
	}
/* Initialize heap Q and Q2 with rows held in Q(1:QLEN) */
	q0 = qlen;
	qlen = 0;
	i__2 = q0;
	for (kk = 1; kk <= i__2; ++kk) {
	    k = q[kk];
	    i__ = irn[k];
	    if (csp <= d__[i__]) {
		d__[i__] = rinf;
		goto L120;
	    }
	    if (d__[i__] <= dmin__) {
		--low;
		q[low] = i__;
		l[i__] = low;
	    } else {
		++qlen;
		l[i__] = qlen;
		mc64dd_(&i__, n, &q[1], &d__[1], &l[1], &c__2);
	    }
/* Update tree */
	    jj = iperm[i__];
	    out[jj] = k;
	    pr[jj] = j;
L120:
	    ;
	}
	i__2 = *num;
	for (jdum = 1; jdum <= i__2; ++jdum) {
/* If Q2 is empty, extract rows from Q */
	    if (low == up) {
		if (qlen == 0) {
		    goto L160;
		}
		i__ = q[1];
		if (d__[i__] >= csp) {
		    goto L160;
		}
		dmin__ = d__[i__];
L152:
		mc64ed_(&qlen, n, &q[1], &d__[1], &l[1], &c__2);
		--low;
		q[low] = i__;
		l[i__] = low;
		if (qlen == 0) {
		    goto L153;
		}
		i__ = q[1];
		if (d__[i__] > dmin__) {
		    goto L153;
		}
		goto L152;
	    }
/* Q0 is row whose distance D(Q0) to the root is smallest */
L153:
	    q0 = q[up - 1];
	    dq0 = d__[q0];
/* Exit loop if path to Q0 is longer than the shortest augmenting path */
	    if (dq0 >= csp) {
		goto L160;
	    }
	    --up;
/* Scan column that matches with row Q0 */
	    j = iperm[q0];
	    vj = dq0 - a[jperm[j]] + u[q0];
	    i__3 = ip[j + 1] - 1;
	    for (k = ip[j]; k <= i__3; ++k) {
		i__ = irn[k];
		if (l[i__] >= up) {
		    goto L155;
		}
/* DNEW is new cost */
		dnew = vj + a[k] - u[i__];
/* Do not update D(I) if DNEW ge cost of shortest path */
		if (dnew >= csp) {
		    goto L155;
		}
		if (iperm[i__] == 0) {
/* Row I is unmatched; update shortest path info */
		    csp = dnew;
		    isp = k;
		    jsp = j;
		} else {
/* Row I is matched; do not update D(I) if DNEW is larger */
		    di = d__[i__];
		    if (di <= dnew) {
			goto L155;
		    }
		    if (l[i__] >= low) {
			goto L155;
		    }
		    d__[i__] = dnew;
		    if (dnew <= dmin__) {
			if (l[i__] != 0) {
			    mc64fd_(&l[i__], &qlen, n, &q[1], &d__[1], &l[1], 
				    &c__2);
			}
			--low;
			q[low] = i__;
			l[i__] = low;
		    } else {
			if (l[i__] == 0) {
			    ++qlen;
			    l[i__] = qlen;
			}
			mc64dd_(&i__, n, &q[1], &d__[1], &l[1], &c__2);
		    }
/* Update tree */
		    jj = iperm[i__];
		    out[jj] = k;
		    pr[jj] = j;
		}
L155:
		;
	    }
/* L150: */
	}
/* If CSP = RINF, no augmenting path is found */
L160:
	if (csp == rinf) {
	    goto L190;
	}
/* Find augmenting path by tracing backward in PR; update IPERM,JPERM */
	++(*num);
	i__ = irn[isp];
	iperm[i__] = jsp;
	jperm[jsp] = isp;
	j = jsp;
	i__2 = *num;
	for (jdum = 1; jdum <= i__2; ++jdum) {
	    jj = pr[j];
	    if (jj == -1) {
		goto L180;
	    }
	    k = out[j];
	    i__ = irn[k];
	    iperm[i__] = jj;
	    jperm[jj] = k;
	    j = jj;
/* L170: */
	}
/* End of dummy loop; this point is never reached */
/* Update U for rows in Q(UP:N) */
L180:
	i__2 = *n;
	for (kk = up; kk <= i__2; ++kk) {
	    i__ = q[kk];
	    u[i__] = u[i__] + d__[i__] - csp;
/* L185: */
	}
L190:
	i__2 = *n;
	for (kk = low; kk <= i__2; ++kk) {
	    i__ = q[kk];
	    d__[i__] = rinf;
	    l[i__] = 0;
/* L191: */
	}
	i__2 = qlen;
	for (kk = 1; kk <= i__2; ++kk) {
	    i__ = q[kk];
	    d__[i__] = rinf;
	    l[i__] = 0;
/* L193: */
	}
L100:
	;
    }
/* End of main loop */
/* Set dual column variable in D(1:N) */
L1000:
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	k = jperm[j];
	if (k != 0) {
	    d__[j] = a[k] - u[irn[k]];
	} else {
	    d__[j] = 0.;
	}
	if (iperm[j] == 0) {
	    u[j] = 0.;
	}
/* L200: */
    }
    if (*num == *n) {
	goto L1100;
    }
/* The matrix is structurally singular, complete IPERM. */
/* JPERM, OUT are work arrays */
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	jperm[j] = 0;
/* L300: */
    }
    k = 0;
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
	if (iperm[i__] == 0) {
	    ++k;
	    out[k] = i__;
	} else {
	    j = iperm[i__];
	    jperm[j] = i__;
	}
/* L310: */
    }
    k = 0;
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	if (jperm[j] != 0) {
	    goto L320;
	}
	++k;
	jdum = out[k];
	iperm[jdum] = j;
L320:
	;
    }
L1100:
    return 0;
}